

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

void __thiscall t_st_generator::generate_force_consts(t_st_generator *this)

{
  ostream *poVar1;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_50;
  string local_30;
  t_st_generator *local_10;
  t_st_generator *this_local;
  
  local_10 = this;
  class_name_abi_cxx11_(&local_50,this);
  prefix(&local_30,this,&local_50);
  poVar1 = std::operator<<((ostream *)&this->f_,(string *)&local_30);
  poVar1 = std::operator<<(poVar1," enums keysAndValuesDo: [:k :v | ");
  class_name_abi_cxx11_(&local_a0,this);
  prefix(&local_80,this,&local_a0);
  poVar1 = std::operator<<(poVar1,(string *)&local_80);
  poVar1 = std::operator<<(poVar1," enums at: k put: v value].!");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  class_name_abi_cxx11_(&local_e0,this);
  prefix(&local_c0,this,&local_e0);
  poVar1 = std::operator<<((ostream *)&this->f_,(string *)&local_c0);
  poVar1 = std::operator<<(poVar1," constants keysAndValuesDo: [:k :v | ");
  class_name_abi_cxx11_(&local_120,this);
  prefix(&local_100,this,&local_120);
  poVar1 = std::operator<<(poVar1,(string *)&local_100);
  poVar1 = std::operator<<(poVar1," constants at: k put: v value].!");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void t_st_generator::generate_force_consts() {
  f_ << prefix(class_name()) << " enums keysAndValuesDo: [:k :v | " << prefix(class_name())
     << " enums at: k put: v value].!" << endl;

  f_ << prefix(class_name()) << " constants keysAndValuesDo: [:k :v | " << prefix(class_name())
     << " constants at: k put: v value].!" << endl;
}